

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

char * __thiscall kj::trimHeaderEnding(kj *this,ArrayPtr<char> content)

{
  size_t sVar1;
  char *pcVar2;
  char *local_28;
  char *end;
  ArrayPtr<char> content_local;
  
  content_local.ptr = content.ptr;
  end = (char *)this;
  sVar1 = ArrayPtr<char>::size((ArrayPtr<char> *)&end);
  if (sVar1 < 2) {
    content_local.size_ = 0;
  }
  else {
    pcVar2 = ArrayPtr<char>::end((ArrayPtr<char> *)&end);
    if (pcVar2[-1] == '\n') {
      local_28 = pcVar2 + -1;
      if (pcVar2[-2] == '\r') {
        local_28 = pcVar2 + -2;
      }
      *local_28 = '\0';
      content_local.size_ = (size_t)local_28;
    }
    else {
      content_local.size_ = 0;
    }
  }
  return (char *)content_local.size_;
}

Assistant:

static char* trimHeaderEnding(kj::ArrayPtr<char> content) {
  // Trim off the trailing \r\n from a header blob.

  if (content.size() < 2) return nullptr;

  // Remove trailing \r\n\r\n and replace with \0 sentinel char.
  char* end = content.end();

  if (end[-1] != '\n') return nullptr;
  --end;
  if (end[-1] == '\r') --end;
  *end = '\0';

  return end;
}